

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fStencilTexturingTests.cpp
# Opt level: O3

void deqp::gles31::Functional::anon_unknown_1::checkDepthStencilFormatSupport
               (Context *context,deUint32 format)

{
  bool bVar1;
  uint uVar2;
  NotSupportedError *this;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  string sStack_98;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  string local_58;
  code *local_38;
  undefined4 local_30;
  
  if (format == 0x8d48) {
    uVar2 = (*context->m_renderCtx->_vptr_RenderContext[2])();
    if ((uVar2 & 0x3ff) != 0x123) {
      bVar1 = glu::ContextInfo::isExtensionSupported
                        (context->m_contextInfo,"GL_OES_texture_stencil8");
      if (!bVar1) {
        this = (NotSupportedError *)__cxa_allocate_exception(0x38);
        local_38 = glu::getTextureFormatName;
        local_30 = 0x8d48;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&sStack_98,&local_38);
        plVar3 = (long *)std::__cxx11::string::append((char *)&sStack_98);
        local_78 = (long *)*plVar3;
        plVar4 = plVar3 + 2;
        if (local_78 == plVar4) {
          local_68 = *plVar4;
          lStack_60 = plVar3[3];
          local_78 = &local_68;
        }
        else {
          local_68 = *plVar4;
        }
        local_70 = plVar3[1];
        *plVar3 = (long)plVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_78);
        local_58._M_dataplus._M_p = (pointer)*plVar3;
        psVar5 = (size_type *)(plVar3 + 2);
        if ((size_type *)local_58._M_dataplus._M_p == psVar5) {
          local_58.field_2._M_allocated_capacity = *psVar5;
          local_58.field_2._8_8_ = plVar3[3];
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        }
        else {
          local_58.field_2._M_allocated_capacity = *psVar5;
        }
        local_58._M_string_length = plVar3[1];
        *plVar3 = (long)psVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        tcu::NotSupportedError::NotSupportedError(this,&local_58);
        __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
      }
    }
  }
  return;
}

Assistant:

static void checkDepthStencilFormatSupport (Context& context, deUint32 format)
{
	if (format == GL_STENCIL_INDEX8)
	{
		const char* reqExt = "GL_OES_texture_stencil8";
		if ((context.getRenderContext().getType().getAPI() != glu::ApiType::core(3,2)) && !context.getContextInfo().isExtensionSupported(reqExt))
			throw tcu::NotSupportedError(glu::getTextureFormatStr(format).toString() + " requires " + reqExt);
	}
	else
	{
		DE_ASSERT(format == GL_DEPTH32F_STENCIL8 || format == GL_DEPTH24_STENCIL8);
	}
}